

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack5(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x1b;
    out_local[1] = *in_local >> 0x16 & 0x1f;
    out_local[2] = *in_local >> 0x11 & 0x1f;
    out_local[3] = *in_local >> 0xc & 0x1f;
    out_local[4] = *in_local >> 7 & 0x1f;
    out_local[5] = *in_local >> 2 & 0x1f;
    out_local[6] = (*in_local & 3) << 3;
    out_local[6] = in_local[1] >> 0x1d | out_local[6];
    out_local[7] = in_local[1] >> 0x18 & 0x1f;
    out_local[8] = in_local[1] >> 0x13 & 0x1f;
    out_local[9] = in_local[1] >> 0xe & 0x1f;
    out_local[10] = in_local[1] >> 9 & 0x1f;
    out_local[0xb] = in_local[1] >> 4 & 0x1f;
    out_local[0xc] = (in_local[1] & 0xf) << 1;
    out_local[0xc] = in_local[2] >> 0x1f | out_local[0xc];
    out_local[0xd] = in_local[2] >> 0x1a & 0x1f;
    out_local[0xe] = in_local[2] >> 0x15 & 0x1f;
    out_local[0xf] = in_local[2] >> 0x10 & 0x1f;
    out_local[0x10] = in_local[2] >> 0xb & 0x1f;
    out_local[0x11] = in_local[2] >> 6 & 0x1f;
    out_local[0x12] = in_local[2] >> 1 & 0x1f;
    out_local[0x13] = (in_local[2] & 1) << 4;
    out_local[0x13] = in_local[3] >> 0x1c | out_local[0x13];
    out_local[0x14] = in_local[3] >> 0x17 & 0x1f;
    out_local[0x15] = in_local[3] >> 0x12 & 0x1f;
    out_local[0x16] = in_local[3] >> 0xd & 0x1f;
    out_local[0x17] = in_local[3] >> 8 & 0x1f;
    out_local[0x18] = in_local[3] >> 3 & 0x1f;
    out_local[0x19] = (in_local[3] & 7) << 2;
    out_local[0x19] = in_local[4] >> 0x1e | out_local[0x19];
    out_local[0x1a] = in_local[4] >> 0x19 & 0x1f;
    out_local[0x1b] = in_local[4] >> 0x14 & 0x1f;
    out_local[0x1c] = in_local[4] >> 0xf & 0x1f;
    out_local[0x1d] = in_local[4] >> 10 & 0x1f;
    out_local[0x1e] = in_local[4] >> 5 & 0x1f;
    out_local[0x1f] = in_local[4] & 0x1f;
    out_local = out_local + 0x20;
    in_local = in_local + 5;
  }
  return;
}

Assistant:

void __vseblocks_unpack5(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 5, --bs) {
    out[0] = in[0] >> 27;
    out[1] = (in[0] >> 22) & 0x1f;
    out[2] = (in[0] >> 17) & 0x1f;
    out[3] = (in[0] >> 12) & 0x1f;
    out[4] = (in[0] >> 7) & 0x1f;
    out[5] = (in[0] >> 2) & 0x1f;
    out[6] = (in[0] << 3) & 0x1f;
    out[6] |= in[1] >> 29;
    out[7] = (in[1] >> 24) & 0x1f;
    out[8] = (in[1] >> 19) & 0x1f;
    out[9] = (in[1] >> 14) & 0x1f;
    out[10] = (in[1] >> 9) & 0x1f;
    out[11] = (in[1] >> 4) & 0x1f;
    out[12] = (in[1] << 1) & 0x1f;
    out[12] |= in[2] >> 0x1f;
    out[13] = (in[2] >> 26) & 0x1f;
    out[14] = (in[2] >> 21) & 0x1f;
    out[15] = (in[2] >> 16) & 0x1f;
    out[16] = (in[2] >> 11) & 0x1f;
    out[17] = (in[2] >> 6) & 0x1f;
    out[18] = (in[2] >> 1) & 0x1f;
    out[19] = (in[2] << 4) & 0x1f;
    out[19] |= in[3] >> 28;
    out[20] = (in[3] >> 23) & 0x1f;
    out[21] = (in[3] >> 18) & 0x1f;
    out[22] = (in[3] >> 13) & 0x1f;
    out[23] = (in[3] >> 8) & 0x1f;
    out[24] = (in[3] >> 3) & 0x1f;
    out[25] = (in[3] << 2) & 0x1f;
    out[25] |= in[4] >> 30;
    out[26] = (in[4] >> 25) & 0x1f;
    out[27] = (in[4] >> 20) & 0x1f;
    out[28] = (in[4] >> 15) & 0x1f;
    out[29] = (in[4] >> 10) & 0x1f;
    out[30] = (in[4] >> 5) & 0x1f;
    out[31] = in[4] & 0x1f;
  }
}